

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O1

chunk_conflict * cave_new(wchar_t height,wchar_t width)

{
  int iVar1;
  chunk_conflict *pcVar2;
  int *piVar3;
  square **ppsVar4;
  uint16_t **ppuVar5;
  square *psVar6;
  void *pvVar7;
  uint16_t *puVar8;
  object **ppoVar9;
  monster *pmVar10;
  monster_group **ppmVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  pcVar2 = (chunk_conflict *)mem_zalloc(0x90);
  pcVar2->height = height;
  pcVar2->width = width;
  piVar3 = (int *)mem_zalloc(0x68);
  pcVar2->feat_count = piVar3;
  ppsVar4 = (square **)mem_zalloc((long)pcVar2->height << 3);
  pcVar2->squares = ppsVar4;
  ppuVar5 = (uint16_t **)mem_zalloc((long)pcVar2->height << 3);
  (pcVar2->noise).grids = ppuVar5;
  ppuVar5 = (uint16_t **)mem_zalloc((long)pcVar2->height << 3);
  (pcVar2->scent).grids = ppuVar5;
  if (0 < pcVar2->height) {
    lVar13 = 0;
    do {
      psVar6 = (square *)mem_zalloc((long)pcVar2->width * 0x28);
      pcVar2->squares[lVar13] = psVar6;
      iVar1 = pcVar2->width;
      if (0 < iVar1) {
        lVar14 = 8;
        lVar12 = 0;
        do {
          pvVar7 = mem_zalloc(3);
          *(void **)(&pcVar2->squares[lVar13]->feat + lVar14) = pvVar7;
          lVar12 = lVar12 + 1;
          iVar1 = pcVar2->width;
          lVar14 = lVar14 + 0x28;
        } while (lVar12 < iVar1);
      }
      puVar8 = (uint16_t *)mem_zalloc((long)iVar1 * 2);
      (pcVar2->noise).grids[lVar13] = puVar8;
      puVar8 = (uint16_t *)mem_zalloc((long)pcVar2->width * 2);
      (pcVar2->scent).grids[lVar13] = puVar8;
      lVar13 = lVar13 + 1;
    } while (lVar13 < pcVar2->height);
  }
  ppoVar9 = (object **)mem_zalloc(0x400);
  pcVar2->objects = ppoVar9;
  pcVar2->obj_max = 0x7f;
  pmVar10 = (monster *)mem_zalloc((ulong)z_info->level_monster_max * 0x1a0);
  pcVar2->monsters = pmVar10;
  pcVar2->mon_max = 1;
  pcVar2->mon_current = L'\xffffffff';
  ppmVar11 = (monster_group **)mem_zalloc((ulong)z_info->level_monster_max << 3);
  pcVar2->monster_groups = ppmVar11;
  pcVar2->turn = turn;
  return pcVar2;
}

Assistant:

struct chunk *cave_new(int height, int width) {
	int y, x;

	struct chunk *c = mem_zalloc(sizeof *c);
	c->height = height;
	c->width = width;
	c->feat_count = mem_zalloc((FEAT_MAX + 1) * sizeof(int));

	c->squares = mem_zalloc(c->height * sizeof(struct square*));
	c->noise.grids = mem_zalloc(c->height * sizeof(uint16_t*));
	c->scent.grids = mem_zalloc(c->height * sizeof(uint16_t*));
	for (y = 0; y < c->height; y++) {
		c->squares[y] = mem_zalloc(c->width * sizeof(struct square));
		for (x = 0; x < c->width; x++) {
			c->squares[y][x].info = mem_zalloc(SQUARE_SIZE * sizeof(bitflag));
		}
		c->noise.grids[y] = mem_zalloc(c->width * sizeof(uint16_t));
		c->scent.grids[y] = mem_zalloc(c->width * sizeof(uint16_t));
	}

	c->objects = mem_zalloc(OBJECT_LIST_SIZE * sizeof(struct object*));
	c->obj_max = OBJECT_LIST_SIZE - 1;

	c->monsters = mem_zalloc(z_info->level_monster_max *sizeof(struct monster));
	c->mon_max = 1;
	c->mon_current = -1;

	c->monster_groups = mem_zalloc(z_info->level_monster_max *
								   sizeof(struct monster_group*));

	c->turn = turn;
	return c;
}